

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfDeque.c
# Opt level: O0

void sbfDeque_pushFront(sbfDeque dq,void *vp)

{
  long lVar1;
  undefined8 *puVar2;
  sbfPool in_RSI;
  long in_RDI;
  sbfDequeItem dqe;
  
  puVar2 = (undefined8 *)sbfPool_get(in_RSI);
  *puVar2 = in_RSI;
  lVar1 = *(long *)(in_RDI + 8);
  puVar2[1] = lVar1;
  if (lVar1 == 0) {
    *(undefined8 **)(in_RDI + 0x10) = puVar2 + 1;
  }
  else {
    *(undefined8 **)(*(long *)(in_RDI + 8) + 0x10) = puVar2 + 1;
  }
  *(undefined8 **)(in_RDI + 8) = puVar2;
  puVar2[2] = in_RDI + 8;
  return;
}

Assistant:

void
sbfDeque_pushFront (sbfDeque dq, void* vp)
{
    sbfDequeItem dqe;

    dqe = sbfPool_get (dq->mPool);
    dqe->mPointer = vp;
    TAILQ_INSERT_HEAD (&dq->mList, dqe, mListEntry);
}